

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTestsPropertiesCommand.cxx
# Opt level: O2

bool cmSetTestsPropertiesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  cmTest *this;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  k;
  string *prop;
  cmAlphaNum *this_00;
  pointer pbVar4;
  cmAlphaNum local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  string local_80;
  cmAlphaNum local_60;
  
  this_00 = &local_b8;
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 == pbVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"called with incorrect number of arguments",
               (allocator<char> *)&local_60);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[11]>>
                      (pbVar4,pbVar1,"PROPERTIES");
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((_Var3._M_current == pbVar2) || (local_88 = _Var3._M_current + 1, local_88 == pbVar2)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "called with illegal arguments, maybe missing a PROPERTIES specifier?",
                 (allocator<char> *)&local_60);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      this_00 = &local_b8;
    }
    else if (((long)pbVar2 - (long)_Var3._M_current >> 5 & 0x8000000000000001U) == 1) {
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (pbVar4 == _Var3._M_current) {
          return true;
        }
        this = cmMakefile::GetTest(status->Makefile,pbVar4);
        prop = local_88;
        if (this == (cmTest *)0x0) break;
        for (; prop != (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish; prop = prop + 2) {
          if (prop->_M_string_length != 0) {
            cmTest::SetProperty(this,prop,prop + 1);
          }
        }
        pbVar4 = pbVar4 + 1;
      }
      local_b8.View_._M_len = 0x28;
      local_b8.View_._M_str = "Can not find test to add properties to: ";
      local_60.View_._M_str = (pbVar4->_M_dataplus)._M_p;
      local_60.View_._M_len = pbVar4->_M_string_length;
      cmStrCat<>(&local_80,&local_b8,&local_60);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      this_00 = (cmAlphaNum *)&local_80;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"called with incorrect number of arguments.",
                 (allocator<char> *)&local_60);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      this_00 = &local_b8;
    }
  }
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool cmSetTestsPropertiesCommand(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // first identify the properties arguments
  auto propsIter = std::find(args.begin(), args.end(), "PROPERTIES");
  if (propsIter == args.end() || propsIter + 1 == args.end()) {
    status.SetError("called with illegal arguments, maybe missing a "
                    "PROPERTIES specifier?");
    return false;
  }

  if (std::distance(propsIter, args.end()) % 2 != 1) {
    status.SetError("called with incorrect number of arguments.");
    return false;
  }

  // loop over all the tests
  for (const std::string& tname : cmStringRange{ args.begin(), propsIter }) {
    if (cmTest* test = status.GetMakefile().GetTest(tname)) {
      // loop through all the props and set them
      for (auto k = propsIter + 1; k != args.end(); k += 2) {
        if (!k->empty()) {
          test->SetProperty(*k, *(k + 1));
        }
      }
    } else {
      status.SetError(
        cmStrCat("Can not find test to add properties to: ", tname));
      return false;
    }
  }
  return true;
}